

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

Flow * __thiscall
wasm::ExpressionRunner<wasm::ModuleRunner>::visitStructNew
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::ModuleRunner> *this,StructNew *curr)

{
  size_t sVar1;
  pointer pFVar2;
  Type *this_00;
  Flow *this_01;
  Expression **ppEVar3;
  Literal *pLVar4;
  HeapType type;
  Field *field;
  uint uVar5;
  ulong index;
  HeapType local_f0;
  HeapType heapType;
  Literal local_d0;
  anon_union_16_5_9943fe1e_for_Literal_0 local_b8;
  undefined1 local_a0 [8];
  Literals data;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  Struct *local_58;
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *local_50;
  Type *local_48;
  StructNew *local_40;
  Flow *local_38;
  
  local_38 = __return_storage_ptr__;
  if ((curr->super_SpecificExpression<(wasm::Expression::Id)60>).super_Expression.type.id == 1) {
    data.super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
    sVar1 = (curr->operands).
            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements;
    local_a0 = (undefined1  [8])&curr->operands;
    while( true ) {
      if ((data.super_SmallVector<wasm::Literal,_1UL>.usedFixed == sVar1) &&
         (local_a0 == (undefined1  [8])&curr->operands)) {
        handle_unreachable("unreachable but no unreachable child",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-interpreter.h"
                           ,0x602);
      }
      ppEVar3 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                operator*((Iterator *)local_a0);
      visit(__return_storage_ptr__,this,*ppEVar3);
      if ((__return_storage_ptr__->breakTo).super_IString.str._M_str != (char *)0x0) break;
      SmallVector<wasm::Literal,_1UL>::~SmallVector
                ((SmallVector<wasm::Literal,_1UL> *)__return_storage_ptr__);
      data.super_SmallVector<wasm::Literal,_1UL>.usedFixed =
           data.super_SmallVector<wasm::Literal,_1UL>.usedFixed + 1;
    }
  }
  else {
    local_48 = &(curr->super_SpecificExpression<(wasm::Expression::Id)60>).super_Expression.type;
    local_40 = curr;
    local_f0 = wasm::Type::getHeapType(local_48);
    local_58 = HeapType::getStruct(&local_f0);
    SmallVector<wasm::Literal,_1UL>::SmallVector
              ((SmallVector<wasm::Literal,_1UL> *)local_a0,
               (long)(local_58->fields).
                     super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(local_58->fields).
                     super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                     super__Vector_impl_data._M_start >> 4);
    local_50 = &(local_40->operands).
                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>;
    uVar5 = 0;
    while( true ) {
      this_00 = local_48;
      index = (ulong)uVar5;
      pFVar2 = (local_58->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(local_58->fields).
                        super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)pFVar2 >> 4) <= index) break;
      field = pFVar2 + index;
      if ((local_40->operands).
          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements ==
          0) {
        Literal::makeZero((Literal *)&local_b8.func,(Type)(field->type).id);
        pLVar4 = (Literal *)
                 ((data.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id - 0x18) +
                 index * 0x18);
        if (index == 0) {
          pLVar4 = (Literal *)&data;
        }
        Literal::operator=(pLVar4,(Literal *)&local_b8.func);
        Literal::~Literal((Literal *)&local_b8.func);
      }
      else {
        ppEVar3 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                            (local_50,index);
        this_01 = local_38;
        visit(local_38,this,*ppEVar3);
        if ((this_01->breakTo).super_IString.str._M_str != (char *)0x0) goto LAB_00790ff5;
        pLVar4 = Flow::getSingleValue(this_01);
        Literal::Literal((Literal *)&heapType,pLVar4);
        truncateForPacking((Literal *)&local_b8.func,this,(Literal *)&heapType,field);
        pLVar4 = (Literal *)
                 ((data.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id - 0x18) +
                 index * 0x18);
        if (index == 0) {
          pLVar4 = (Literal *)&data;
        }
        Literal::operator=(pLVar4,(Literal *)&local_b8.func);
        Literal::~Literal((Literal *)&local_b8.func);
        Literal::~Literal((Literal *)&heapType);
        SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)local_38);
      }
      uVar5 = uVar5 + 1;
    }
    local_b8.i64 = (int64_t)wasm::Type::getHeapType(local_48);
    std::make_shared<wasm::GCData,wasm::HeapType,wasm::Literals&>
              ((HeapType *)
               &data.super_SmallVector<wasm::Literal,_1UL>.flexible.
                super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(Literals *)&local_b8.func);
    type = wasm::Type::getHeapType(this_00);
    Literal::Literal(&local_d0,
                     (shared_ptr<wasm::GCData> *)
                     &data.super_SmallVector<wasm::Literal,_1UL>.flexible.
                      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,type);
    Flow::Flow(local_38,&local_d0);
    Literal::~Literal(&local_d0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60);
LAB_00790ff5:
    SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)local_a0);
    __return_storage_ptr__ = local_38;
  }
  return __return_storage_ptr__;
}

Assistant:

Flow visitStructNew(StructNew* curr) {
    NOTE_ENTER("StructNew");
    if (curr->type == Type::unreachable) {
      // We cannot proceed to compute the heap type, as there isn't one. Just
      // find why we are unreachable, and stop there.
      for (auto* operand : curr->operands) {
        auto value = self()->visit(operand);
        if (value.breaking()) {
          return value;
        }
      }
      WASM_UNREACHABLE("unreachable but no unreachable child");
    }
    auto heapType = curr->type.getHeapType();
    const auto& fields = heapType.getStruct().fields;
    Literals data(fields.size());
    for (Index i = 0; i < fields.size(); i++) {
      auto& field = fields[i];
      if (curr->isWithDefault()) {
        data[i] = Literal::makeZero(field.type);
      } else {
        auto value = self()->visit(curr->operands[i]);
        if (value.breaking()) {
          return value;
        }
        data[i] = truncateForPacking(value.getSingleValue(), field);
      }
    }
    return Literal(std::make_shared<GCData>(curr->type.getHeapType(), data),
                   curr->type.getHeapType());
  }